

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O1

UNION__gl_enumeration __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::toUnionPrefix_UNION__gl_enumeration
          (ColladaParserAutoGen14Private *this,ParserChar *prefixedBuffer,
          ParserChar *prefixedBufferEnd,ParserChar **buffer,ParserChar *bufferEnd,bool *failed)

{
  ParserChar *__dest;
  UNION__gl_enumeration UVar1;
  byte *pbVar2;
  byte *__src;
  size_t __n;
  byte *pbVar3;
  size_t __n_00;
  ParserChar *__dest_00;
  ParserChar *newBufferPostParse;
  ParserChar *local_38;
  
  __src = (byte *)0x0;
  pbVar3 = (byte *)prefixedBuffer;
  if (prefixedBuffer != prefixedBufferEnd) {
    do {
      pbVar2 = __src;
      if (__src == (byte *)0x0) {
        pbVar2 = pbVar3;
      }
      if ((0x100002600U >> (*pbVar3 & 0x3f) & 1) == 0) {
        __src = pbVar2;
      }
      if (0x20 < *pbVar3) {
        __src = pbVar2;
      }
      pbVar3 = pbVar3 + 1;
      prefixedBuffer = prefixedBufferEnd;
    } while (pbVar3 != (byte *)prefixedBufferEnd);
  }
  if (__src == (byte *)0x0) {
    UVar1 = toUnion_UNION__gl_enumeration(buffer,bufferEnd,failed);
    return UVar1;
  }
  __n = 0;
  while ((0x20 < (ulong)(byte)(*buffer)[__n] ||
         ((0x100002600U >> ((ulong)(byte)(*buffer)[__n] & 0x3f) & 1) == 0))) {
    __n = __n + 1;
  }
  __n_00 = (long)prefixedBuffer - (long)__src;
  __dest = (ParserChar *)
           GeneratedSaxParser::StackMemoryManager::newObject
                     (&(this->
                       super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                       ).super_ParserTemplateBase.mStackMemoryManager,__n_00 + __n + 1);
  memcpy(__dest,__src,__n_00);
  __dest_00 = __dest + __n_00;
  memcpy(__dest_00,*buffer,__n);
  __dest_00[__n] = ' ';
  local_38 = __dest;
  UVar1 = toUnion_UNION__gl_enumeration(&local_38,__dest + __n_00 + __n + 1,failed);
  *buffer = *buffer + ((long)local_38 - (long)__dest_00);
  return UVar1;
}

Assistant:

UNION__gl_enumeration ColladaParserAutoGen14Private::toUnionPrefix_UNION__gl_enumeration (
    const ParserChar* prefixedBuffer,
    const ParserChar* prefixedBufferEnd,
    const ParserChar** buffer,
    const ParserChar* bufferEnd,
    bool& failed
)
{
    return toDataPrefix<UNION__gl_enumeration>(prefixedBuffer, prefixedBufferEnd, buffer, bufferEnd, failed, toUnion_UNION__gl_enumeration);
}